

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtBroadphasePair>::resize
          (cbtAlignedObjectArray<cbtBroadphasePair> *this,int newsize,cbtBroadphasePair *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  cbtBroadphasePair *pcVar3;
  cbtBroadphaseProxy *pcVar4;
  ulong uVar5;
  long lVar6;
  
  iVar2 = this->m_size;
  lVar6 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    uVar5 = lVar6 << 5 | 0x18;
    for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
      pcVar4 = fillData->m_pProxy1;
      pcVar3 = this->m_data;
      puVar1 = (undefined8 *)((long)pcVar3 + (uVar5 - 0x18));
      *puVar1 = fillData->m_pProxy0;
      puVar1[1] = pcVar4;
      *(cbtCollisionAlgorithm **)((long)pcVar3 + (uVar5 - 8)) = fillData->m_algorithm;
      *(anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 *)((long)&pcVar3->m_pProxy0 + uVar5) =
           fillData->field_3;
      uVar5 = uVar5 + 0x20;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}